

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

void __thiscall Catch::SonarQubeReporter::writeRun(SonarQubeReporter *this,TestRunNode *runNode)

{
  bool bVar1;
  vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  *this_00;
  Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode> *pNVar2;
  mapped_type *this_01;
  reference ppVar3;
  pair<const_Catch::StringRef,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>_>
  *kv;
  iterator __end1_1;
  iterator __begin1_1;
  map<Catch::StringRef,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>,_std::less<Catch::StringRef>,_std::allocator<std::pair<const_Catch::StringRef,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>_>_>_>
  *__range1_1;
  StringRef local_78;
  reference local_68;
  unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
  *child;
  const_iterator __end1;
  const_iterator __begin1;
  ChildNodes *__range1;
  map<Catch::StringRef,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>,_std::less<Catch::StringRef>,_std::allocator<std::pair<const_Catch::StringRef,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>_>_>_>
  testsPerFile;
  TestRunNode *runNode_local;
  SonarQubeReporter *this_local;
  
  testsPerFile._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)runNode;
  std::
  map<Catch::StringRef,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>,_std::less<Catch::StringRef>,_std::allocator<std::pair<const_Catch::StringRef,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>_>_>_>
  ::map((map<Catch::StringRef,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>,_std::less<Catch::StringRef>,_std::allocator<std::pair<const_Catch::StringRef,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>_>_>_>
         *)&__range1);
  this_00 = (vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
             *)(testsPerFile._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x58);
  __end1 = std::
           vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
           ::begin(this_00);
  child = (unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
           *)std::
             vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
             ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
                                *)&child);
    if (!bVar1) break;
    local_68 = __gnu_cxx::
               __normal_iterator<const_Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
               ::operator*(&__end1);
    pNVar2 = Detail::
             unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
             ::operator->(local_68);
    StringRef::StringRef(&local_78,(((pNVar2->value).testInfo)->lineInfo).file);
    this_01 = std::
              map<Catch::StringRef,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>,_std::less<Catch::StringRef>,_std::allocator<std::pair<const_Catch::StringRef,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>_>_>_>
              ::operator[]((map<Catch::StringRef,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>,_std::less<Catch::StringRef>,_std::allocator<std::pair<const_Catch::StringRef,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>_>_>_>
                            *)&__range1,&local_78);
    __range1_1 = (map<Catch::StringRef,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>,_std::less<Catch::StringRef>,_std::allocator<std::pair<const_Catch::StringRef,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>_>_>_>
                  *)Detail::
                    unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
                    ::get(local_68);
    std::
    vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>
    ::push_back(this_01,(value_type *)&__range1_1);
    __gnu_cxx::
    __normal_iterator<const_Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             map<Catch::StringRef,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>,_std::less<Catch::StringRef>,_std::allocator<std::pair<const_Catch::StringRef,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>_>_>_>
             ::begin((map<Catch::StringRef,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>,_std::less<Catch::StringRef>,_std::allocator<std::pair<const_Catch::StringRef,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>_>_>_>
                      *)&__range1);
  kv = (pair<const_Catch::StringRef,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>_>
        *)std::
          map<Catch::StringRef,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>,_std::less<Catch::StringRef>,_std::allocator<std::pair<const_Catch::StringRef,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>_>_>_>
          ::end((map<Catch::StringRef,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>,_std::less<Catch::StringRef>,_std::allocator<std::pair<const_Catch::StringRef,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>_>_>_>
                 *)&__range1);
  while( true ) {
    bVar1 = std::operator!=(&__end1_1,(_Self *)&kv);
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_Catch::StringRef,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>_>_>
             ::operator*(&__end1_1);
    writeTestFile(this,ppVar3->first,&ppVar3->second);
    std::
    _Rb_tree_iterator<std::pair<const_Catch::StringRef,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>_>_>
    ::operator++(&__end1_1);
  }
  std::
  map<Catch::StringRef,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>,_std::less<Catch::StringRef>,_std::allocator<std::pair<const_Catch::StringRef,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>_>_>_>
  ::~map((map<Catch::StringRef,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>,_std::less<Catch::StringRef>,_std::allocator<std::pair<const_Catch::StringRef,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>_>_>_>
          *)&__range1);
  return;
}

Assistant:

void SonarQubeReporter::writeRun( TestRunNode const& runNode ) {
        std::map<StringRef, std::vector<TestCaseNode const*>> testsPerFile;

        for ( auto const& child : runNode.children ) {
            testsPerFile[child->value.testInfo->lineInfo.file].push_back(
                child.get() );
        }

        for ( auto const& kv : testsPerFile ) {
            writeTestFile( kv.first, kv.second );
        }
    }